

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O1

void __thiscall
sznet::net::KcpWithTcpServer::onThreadInitCallback(KcpWithTcpServer *this,KcpTcpEventLoop *loop)

{
  KcpTcpEventLoop *local_20;
  
  if ((this->m_kcpConnectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
              (&loop->m_kcpConnectionCallback,&this->m_kcpConnectionCallback);
  }
  if ((this->m_kcpMessageCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::operator=(&loop->m_kcpMessageCallback,&this->m_kcpMessageCallback);
  }
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
            (&loop->m_kcpWriteCompleteCallback,&this->m_kcpWriteCompleteCallback);
  loop->m_kcpMode = this->m_kcpMode;
  if ((this->m_threadInitCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_20 = loop;
    (*(this->m_threadInitCallback)._M_invoker)((_Any_data *)&this->m_threadInitCallback,&local_20);
  }
  return;
}

Assistant:

void KcpWithTcpServer::onThreadInitCallback(KcpTcpEventLoop* loop)
{
	if (m_kcpConnectionCallback)
	{
		loop->setKcpConnectionCallback(m_kcpConnectionCallback);
	}
	if (m_kcpMessageCallback)
	{
		loop->setKcpMessageCallback(m_kcpMessageCallback);
	}
	loop->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
	loop->setKcpMode(m_kcpMode);
	if (m_threadInitCallback)
	{
		m_threadInitCallback(loop);
	}
}